

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void jcopy_markers_setup(j_decompress_ptr srcinfo,JCOPY_OPTION option)

{
  int in_ESI;
  undefined8 in_RDI;
  j_decompress_ptr unaff_retaddr;
  int m;
  int local_10;
  
  if ((in_ESI != 0) && (in_ESI != 4)) {
    jpeg_save_markers(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if ((in_ESI == 2) || (in_ESI == 3)) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      if ((in_ESI != 3) || (local_10 != 2)) {
        jpeg_save_markers(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      }
    }
  }
  if (in_ESI == 4) {
    jpeg_save_markers(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_markers_setup(j_decompress_ptr srcinfo, JCOPY_OPTION option)
{
#ifdef SAVE_MARKERS_SUPPORTED
  int m;

  /* Save comments except under NONE option */
  if (option != JCOPYOPT_NONE && option != JCOPYOPT_ICC) {
    jpeg_save_markers(srcinfo, JPEG_COM, 0xFFFF);
  }
  /* Save all types of APPn markers iff ALL option */
  if (option == JCOPYOPT_ALL || option == JCOPYOPT_ALL_EXCEPT_ICC) {
    for (m = 0; m < 16; m++) {
      if (option == JCOPYOPT_ALL_EXCEPT_ICC && m == 2)
        continue;
      jpeg_save_markers(srcinfo, JPEG_APP0 + m, 0xFFFF);
    }
  }
  /* Save only APP2 markers if ICC option selected */
  if (option == JCOPYOPT_ICC) {
    jpeg_save_markers(srcinfo, JPEG_APP0 + 2, 0xFFFF);
  }
#endif /* SAVE_MARKERS_SUPPORTED */
}